

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

QPDFAcroFormDocumentHelper *
get_afdh_for_qpdf(map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
                  *afdh_map,QPDF *q)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  QPDFAcroFormDocumentHelper *pQVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  unsigned_long_long uid;
  undefined1 local_29;
  QPDFAcroFormDocumentHelper *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  unsigned_long_long local_18;
  
  local_18 = QPDF::getUniqueId(q);
  p_Var1 = &(afdh_map->_M_t)._M_impl.super__Rb_tree_header;
  p_Var6 = (afdh_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < local_18]) {
    if (*(ulong *)(p_Var6 + 1) >= local_18) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, local_18 < *(ulong *)(p_Var5 + 1)))
  {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    local_28 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
              (&_Stack_20,&local_28,(allocator<QPDFAcroFormDocumentHelper> *)&local_29,q);
    pmVar4 = std::
             map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
             ::operator[](afdh_map,&local_18);
    _Var3._M_pi = _Stack_20._M_pi;
    pQVar2 = local_28;
    local_28 = (QPDFAcroFormDocumentHelper *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (pmVar4->super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
    (pmVar4->super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         pQVar2;
    (pmVar4->super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
    ._M_pi = _Var3._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  pmVar4 = std::
           map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
           ::operator[](afdh_map,&local_18);
  return (pmVar4->super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
}

Assistant:

static QPDFAcroFormDocumentHelper*
get_afdh_for_qpdf(
    std::map<unsigned long long, std::shared_ptr<QPDFAcroFormDocumentHelper>>& afdh_map, QPDF* q)
{
    auto uid = q->getUniqueId();
    if (!afdh_map.count(uid)) {
        afdh_map[uid] = std::make_shared<QPDFAcroFormDocumentHelper>(*q);
    }
    return afdh_map[uid].get();
}